

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.h
# Opt level: O1

LightRayRecord __thiscall cert::PointLight::visible(PointLight *this,Vec3 *point,Vec3 *normal)

{
  LightRayRecord LVar1;
  float fVar2;
  float fVar3;
  double dVar4;
  double dVar5;
  float fVar6;
  float fVar7;
  undefined4 local_20;
  
  fVar6 = (this->super_Light).position.x - point->x;
  fVar2 = (this->super_Light).position.y - point->y;
  fVar7 = (this->super_Light).position.z - point->z;
  fVar3 = fVar7 * fVar7 + fVar6 * fVar6 + fVar2 * fVar2;
  dVar4 = sqrt((double)(ulong)(uint)fVar3);
  dVar5 = sqrt((double)(ulong)(uint)fVar3);
  fVar3 = SUB84(dVar5,0);
  fVar3 = (fVar7 / fVar3) * normal->z + (fVar6 / fVar3) * normal->x + (fVar2 / fVar3) * normal->y;
  local_20 = CONCAT31(local_20._1_3_,0.0 < fVar3);
  fVar2 = this->strength;
  fVar6 = SUB84(dVar4,0) * SUB84(dVar4,0);
  LVar1.attenuation.y = ((this->super_Light).color.y * fVar3 * fVar2) / fVar6;
  LVar1.attenuation.x = ((this->super_Light).color.x * fVar3 * fVar2) / fVar6;
  LVar1._0_4_ = local_20;
  LVar1.attenuation.z = (fVar3 * (this->super_Light).color.z * fVar2) / fVar6;
  return LVar1;
}

Assistant:

constexpr LightRayRecord visible (Vec3 const& point, Vec3 const& normal) override
	{
		Vec3 direction = position - point;
		float distance = direction.length ();
		float lambert = dot (normal, normalize (direction));

		return { .visible = lambert > 0.0f, .attenuation = color * lambert * strength / (distance * distance) };
	}